

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall pfederc::BiOpExpr::~BiOpExpr(BiOpExpr *this)

{
  BiOpExpr *this_local;
  
  ~BiOpExpr(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

BiOpExpr::~BiOpExpr() {
}